

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v9::detail::bigint::assign_pow10(bigint *this,int exp)

{
  uint uVar1;
  uint in_ESI;
  undefined8 in_RDI;
  int bitmask;
  bigint *in_stack_00000018;
  bigint *in_stack_00000130;
  int line;
  uint in_stack_fffffffffffffff0;
  int iVar2;
  
  line = (int)((ulong)in_RDI >> 0x20);
  if ((int)in_ESI < 0) {
    assert_fail((char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),line,(char *)0x1e3e67);
  }
  if (in_ESI == 0) {
    operator=((bigint *)(ulong)in_stack_fffffffffffffff0,line);
  }
  else {
    for (iVar2 = 1; iVar2 <= (int)in_ESI; iVar2 = iVar2 << 1) {
    }
    uVar1 = iVar2 >> 1;
    operator=((bigint *)CONCAT44(in_ESI,uVar1),line);
    while( true ) {
      uVar1 = (int)uVar1 >> 1;
      if (uVar1 == 0) break;
      square(in_stack_00000130);
      if ((in_ESI & uVar1) != 0) {
        operator*=((bigint *)CONCAT44(in_ESI,uVar1),(int)((ulong)in_RDI >> 0x20));
      }
    }
    operator<<=(in_stack_00000018,this._4_4_);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign_pow10(int exp) {
    FMT_ASSERT(exp >= 0, "");
    if (exp == 0) return *this = 1;
    // Find the top bit.
    int bitmask = 1;
    while (exp >= bitmask) bitmask <<= 1;
    bitmask >>= 1;
    // pow(10, exp) = pow(5, exp) * pow(2, exp). First compute pow(5, exp) by
    // repeated squaring and multiplication.
    *this = 5;
    bitmask >>= 1;
    while (bitmask != 0) {
      square();
      if ((exp & bitmask) != 0) *this *= 5;
      bitmask >>= 1;
    }
    *this <<= exp;  // Multiply by pow(2, exp) by shifting.
  }